

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::variable(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Expression> pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Token local_70;
  string local_38 [8];
  Identifier ident;
  Parser *this_local;
  ptr<Expression> *expr;
  
  token(&local_70,in_RSI);
  std::__cxx11::string::string(local_38,(string *)&local_70.lexeme);
  Token::~Token(&local_70);
  consume(in_RSI,Identifier,"identifier");
  local_90.field_2._M_local_buf[3] = '\0';
  make<Symbol,std::__cxx11::string&>(&local_90);
  std::shared_ptr<Expression>::shared_ptr<Symbol,void>
            ((shared_ptr<Expression> *)this,(shared_ptr<Symbol> *)&local_90);
  std::shared_ptr<Symbol>::~shared_ptr((shared_ptr<Symbol> *)&local_90);
  local_90.field_2._M_local_buf[3] = '\x01';
  std::__cxx11::string::~string(local_38);
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar1.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::variable() {
    Identifier ident = token().lexeme;
    consume(TokenType::Identifier, "identifier");
    ptr<Expression> expr = make<Symbol>(ident);
    return expr;
}